

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O2

int MPIX_skewed_kdtree_cart_create
              (MPI_Comm old_comm,int *dims,int num_dims,int *stencil,int stencil_size,int *periods,
              MPI_Comm *cart_comm)

{
  int i;
  int *factors;
  int *coordinate;
  int *dims_00;
  long lVar1;
  int iVar2;
  size_t __nmemb;
  int world_rank;
  int world_size;
  int *local_50;
  int *local_48;
  MPI_Comm sorted_comm;
  MPI_Comm tmp;
  
  local_50 = stencil;
  local_48 = periods;
  mpireorderinglib::MPIX_Node_comm(old_comm,&sorted_comm,(int *)0x0,(int *)0x0,NODES_MEAN);
  __nmemb = (size_t)num_dims;
  factors = (int *)malloc(__nmemb * 8);
  MPI_Comm_size(sorted_comm,&world_size);
  MPI_Comm_rank(sorted_comm,&world_rank);
  coordinate = (int *)calloc(__nmemb,4);
  dims_00 = (int *)malloc(__nmemb * 4);
  memcpy(dims_00,dims,__nmemb * 4);
  calculate_factors(factors,num_dims,local_50,stencil_size);
  skewed_find_node_recursive(dims_00,num_dims,world_size,world_rank,coordinate,factors);
  iVar2 = *coordinate;
  for (lVar1 = 1; lVar1 < (long)__nmemb; lVar1 = lVar1 + 1) {
    iVar2 = iVar2 * dims[lVar1] + coordinate[lVar1];
  }
  MPI_Comm_split(sorted_comm,0,iVar2,&tmp);
  iVar2 = MPI_Cart_create(tmp,num_dims,dims,local_48,0,cart_comm);
  MPI_Comm_free(&tmp);
  MPI_Comm_free(&sorted_comm);
  free(factors);
  free(dims_00);
  free(coordinate);
  return iVar2;
}

Assistant:

int
MPIX_skewed_kdtree_cart_create(MPI_Comm old_comm, const int *dims, int num_dims, const int *stencil, int stencil_size,
                               const int * const periods, MPI_Comm *cart_comm) {
    MPI_Comm sorted_comm;
    mpireorderinglib::MPIX_Node_comm(old_comm, &sorted_comm);
    int *factors = static_cast<int *>(malloc(num_dims * sizeof(double)));
    int world_size;
    MPI_Comm_size(sorted_comm, &world_size);
    int world_rank;
    MPI_Comm_rank(sorted_comm, &world_rank);

    int *coordinate = static_cast<int *>(calloc(num_dims, sizeof(int)));
    int *dims_heper = static_cast<int *>(malloc(num_dims * sizeof(int)));
    memcpy(dims_heper, dims, num_dims * sizeof(int));

    // calculating these factors is only used in the skewed kd-tree variant
    calculate_factors(factors, num_dims, stencil, stencil_size);
    // actual coordinate calculation
    skewed_find_node_recursive(dims_heper, num_dims, world_size, world_rank, coordinate, factors);

    int new_rank = coordinate[0];
    for (int i = 1; i < num_dims; i++) {
        new_rank = new_rank * dims[i] + coordinate[i];
    }

    MPI_Comm tmp;
    MPI_Comm_split(sorted_comm, 0, new_rank, &tmp);
    int err = MPI_Cart_create(tmp, num_dims, dims, periods, 0, cart_comm);
    MPI_Comm_free(&tmp);
    MPI_Comm_free(&sorted_comm);
    free(factors);
    free(dims_heper);
    free(coordinate);
    return err;
}